

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  uVar4 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar2 = (uint)uVar4;
      *pbVar6 = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      pbVar6 = pbVar6 + 1;
    } while (0x3fff < uVar2);
  }
  *pbVar6 = (byte)uVar4;
  output->cur_ = pbVar6 + 1;
  uVar2 = MessageLite::GetCachedSize(value);
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  uVar5 = uVar2;
  if (0x7f < uVar2) {
    do {
      *pbVar6 = (byte)uVar5 | 0x80;
      uVar2 = uVar5 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar1 = 0x3fff < uVar5;
      uVar5 = uVar2;
    } while (bVar1);
  }
  *pbVar6 = (byte)uVar2;
  output->cur_ = pbVar6 + 1;
  iVar3 = (*value->_vptr_MessageLite[5])(value,pbVar6 + 1,output);
  output->cur_ = (uint8_t *)CONCAT44(extraout_var,iVar3);
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  WriteSubMessageMaybeToArray(size, value, output);
}